

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CClass *stm)

{
  CIdExp *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  CFieldList *pCVar3;
  CMethodList *pCVar4;
  bool bVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  ostream *poVar8;
  shared_ptr<ClassInfo> local_78;
  shared_ptr<ClassInfo> local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_48 [8];
  char local_40 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: class\n",0x13);
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (((pCVar1 == (CIdExp *)0x0) ||
      ((stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
       super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
       super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl == (CFieldList *)0x0)) ||
     ((stm->methods)._M_t.super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>._M_t
      .super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
      super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl == (CMethodList *)0x0)) {
    CError::CError((CError *)local_58,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_58);
    pcVar7 = local_48;
    local_50._M_p = (pointer)local_58;
    goto LAB_00121f9d;
  }
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&pCVar1->name);
  (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar6->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(pmVar6->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Before cyclic check\n",0x14);
  local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
      local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00122000;
    }
    else {
      (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
LAB_00122000:
  bVar5 = checkCyclicInheritance(this,&local_68,&local_78);
  if (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cyclic inheritance was checked for class: ",0x2a);
  peVar2 = (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(peVar2->name)._M_dataplus._M_p,
                      (peVar2->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if (bVar5) {
    CError::CError((CError *)local_58,&CError::CYCLIC_INHERITANCE_abi_cxx11_,
                   (PositionInfo *)
                   ((long)&(((stm->parentClass)._M_t.
                             super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                             super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->super_IExpression
                           ).super_PositionedNode + 8));
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_58);
    if (local_58 == (undefined1  [8])local_48) {
      return;
    }
    operator_delete((void *)local_58);
    return;
  }
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  pCVar3 = (stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
           _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar3->super_IWrapper).super_PositionedNode)(pCVar3,this);
  pCVar4 = (stm->methods)._M_t.super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>
           ._M_t.super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
           super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  TypeInfo::TypeInfo((TypeInfo *)local_58,VOID);
  (this->lastCalculatedType).isPrimitive = (bool)local_58[0];
  *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_58._1_3_;
  (this->lastCalculatedType).type = local_58._4_4_;
  std::__cxx11::string::operator=
            ((string *)&(this->lastCalculatedType).className,(string *)&local_50);
  pcVar7 = local_40;
LAB_00121f9d:
  if (local_50._M_p != pcVar7) {
    operator_delete(local_50._M_p);
  }
  this_00 = (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CClass &stm ) 
{
	std::cout << "typechecker: class\n";
    if( stm.id && stm.fields && stm.methods ) {
        currentClass = table->classes[stm.id->name];
        std::cout << "Before cyclic check\n";
        bool isBadInherited = checkCyclicInheritance( currentClass, currentClass );
        std::cout << "Cyclic inheritance was checked for class: " << currentClass->name << "\n";
        if( isBadInherited ) {
            errors.push_back( CError( CError::CYCLIC_INHERITANCE, stm.parentClass->position ) );
            return;
        }
        stm.id->Accept( *this );
        stm.fields->Accept( *this );
        stm.methods->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentClass = nullptr;
}